

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg_st.cpp
# Opt level: O3

MPP_RET mpp_sys_cfg_st_get_v_stride(MppSysCfgStVStrd *v_stride_cfg)

{
  MPP_RET MVar1;
  char *pcVar2;
  MppSysCfg cfg;
  MppSysCfg local_20;
  
  MVar1 = mpp_sys_cfg_get(&local_20);
  if (MVar1 == MPP_OK) {
    mpp_sys_cfg_set_u32(local_20,"dec_buf_chk:enable",1);
    mpp_sys_cfg_set_u32(local_20,"dec_buf_chk:type",v_stride_cfg->type);
    mpp_sys_cfg_set_u32(local_20,"dec_buf_chk:fmt_fbc",v_stride_cfg->fmt_fbc);
    mpp_sys_cfg_set_u32(local_20,"dec_buf_chk:height",v_stride_cfg->height);
    mpp_sys_cfg_set_u32(local_20,"dec_buf_chk:v_stride",v_stride_cfg->v_stride);
    mpp_sys_cfg_ioctl(local_20);
    mpp_sys_cfg_get_u32(local_20,"dec_buf_chk:v_stride",&v_stride_cfg->v_stride);
    MVar1 = mpp_sys_cfg_put(local_20);
    if (MVar1 == MPP_OK) {
      pcVar2 = "success";
      MVar1 = MPP_OK;
      goto LAB_00155532;
    }
    pcVar2 = "mpp_sys_cfg_put failed\n";
  }
  else {
    pcVar2 = "mpp_sys_cfg_get failed\n";
  }
  _mpp_log_l(2,"mpp_sys_cfg_st",pcVar2,(char *)0x0);
  pcVar2 = "failed";
LAB_00155532:
  _mpp_log_l(2,"mpp_sys_cfg_st","sys cfg get paras %s\n","mpp_sys_cfg_st_get_v_stride",pcVar2);
  return MVar1;
}

Assistant:

MPP_RET mpp_sys_cfg_st_get_v_stride(MppSysCfgStVStrd *v_stride_cfg)
{
    MPP_RET ret = MPP_OK;
    MppSysCfg cfg;

    ret = mpp_sys_cfg_get(&cfg);
    if (ret) {
        mpp_err("mpp_sys_cfg_get failed\n");
        goto DONE;
    }

    /* set correct parameter */
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:enable", 1);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:type", v_stride_cfg->type);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:fmt_fbc", v_stride_cfg->fmt_fbc);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:height", v_stride_cfg->height);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:v_stride", v_stride_cfg->v_stride);

    /* get result */
    mpp_sys_cfg_ioctl(cfg);

    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:v_stride", &v_stride_cfg->v_stride);

    ret = mpp_sys_cfg_put(cfg);
    if (ret) {
        mpp_err("mpp_sys_cfg_put failed\n");
        goto DONE;
    }

DONE:
    mpp_err_f("sys cfg get paras %s\n", ret ? "failed" : "success");
    return ret;
}